

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::BindStaticResources
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          SHADER_TYPE ShaderStages,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags)

{
  PIPELINE_TYPE PipelineType;
  char cVar1;
  uint uVar2;
  SHADER_TYPE SVar3;
  long lVar4;
  string msg;
  string local_50;
  
  PipelineType = this->m_PipelineType;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    cVar1 = (this->m_StaticResStageIndex)._M_elems[lVar4];
    if (-1 < cVar1) {
      uVar2 = this->m_StaticResShaderStages - (this->m_StaticResShaderStages >> 1 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f;
      if (uVar2 * 0x1010101 >> 0x18 <= (uint)(int)cVar1) {
        FormatString<char[26],char[58]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)uVar2);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"BindStaticResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x200);
        std::__cxx11::string::~string((string *)&local_50);
      }
      SVar3 = GetShaderTypeFromPipelineIndex((Int32)lVar4,PipelineType);
      if ((SVar3 & ShaderStages) != SHADER_TYPE_UNKNOWN) {
        ShaderVariableManagerVk::BindResources
                  (this->m_StaticVarsMgrs + (uint)(int)cVar1,pResourceMapping,Flags);
      }
    }
  }
  return;
}

Assistant:

BindStaticResources(SHADER_TYPE                 ShaderStages,
                                                        IResourceMapping*           pResourceMapping,
                                                        BIND_SHADER_RESOURCES_FLAGS Flags) override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        for (Uint32 ShaderInd = 0; ShaderInd < m_StaticResStageIndex.size(); ++ShaderInd)
        {
            const int VarMngrInd = m_StaticResStageIndex[ShaderInd];
            if (VarMngrInd >= 0)
            {
                VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
                // ShaderInd is the shader type pipeline index here
                const SHADER_TYPE ShaderType = GetShaderTypeFromPipelineIndex(ShaderInd, PipelineType);
                if (ShaderStages & ShaderType)
                {
                    m_StaticVarsMgrs[VarMngrInd].BindResources(pResourceMapping, Flags);
                }
            }
        }
    }